

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

void __thiscall
nodecpp::log::Log::log<char_const*,char_const*,int>
          (Log *this,ModuleID *mid,LogLevel l,char *format_str,char *obj,int obj_1)

{
  LogTransport *pLVar1;
  ulong uVar2;
  ulong sz;
  LogTransport *transport;
  LogTransport *this_00;
  format_to_n_result<char_*> fVar3;
  char msgFormatted [4096];
  int local_1054;
  ModuleID local_1050;
  char *local_1048;
  char *local_1040;
  char local_1038 [4104];
  
  if ((int)l <= (int)this->level) {
    local_1054 = obj_1;
    local_1048 = obj;
    local_1040 = format_str;
    fVar3 = fmt::v7::format_to_n<char_*,_const_char_*,_const_char_*,_int,_0>
                      (local_1038,0xfff,&local_1040,&local_1048,&local_1054);
    sz = fVar3.size;
    uVar2 = sz;
    if (0xfff < sz) {
      uVar2 = 0xfff;
    }
    local_1038[uVar2] = '\0';
    pLVar1 = (this->transports).
             super__Vector_base<nodecpp::log::LogTransport,_std::allocator<nodecpp::log::LogTransport>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->transports).
                   super__Vector_base<nodecpp::log::LogTransport,_std::allocator<nodecpp::log::LogTransport>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pLVar1;
        this_00 = this_00 + 1) {
      local_1050 = (ModuleID)mid->str;
      LogTransport::writoToLog(this_00,&local_1050,local_1038,sz,l,this->addTimeStamp);
    }
  }
  return;
}

Assistant:

void log( ModuleID mid, LogLevel l, StringT format_str, Objects ... obj ) {
			if ( l <= level ) {
				char msgFormatted[LogBufferBaseData::maxMessageSize];
				auto r = ::fmt::format_to_n( msgFormatted, LogBufferBaseData::maxMessageSize-1, format_str, obj ... );
				if ( r.size >= LogBufferBaseData::maxMessageSize )
					msgFormatted[LogBufferBaseData::maxMessageSize-1] = 0;
				else
					msgFormatted[r.size] = 0;
				for ( auto& transport : transports )
					transport.writoToLog( mid, msgFormatted, r.size, l, addTimeStamp );
			}				 
		}